

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int VmOverloadCompare(SyString *pFirst,SyString *pSecond)

{
  char *zPtr;
  char *zFin;
  char *zSin;
  char *zFend;
  char *zSend;
  SyString *pSecond_local;
  SyString *pFirst_local;
  
  zFin = pSecond->zString;
  for (zPtr = pFirst->zString;
      ((zPtr < pFirst->zString + pFirst->nByte && (zFin < pSecond->zString + pSecond->nByte)) &&
      (*zPtr == *zFin)); zPtr = zPtr + 1) {
    zFin = zFin + 1;
  }
  return (int)zPtr - (int)pFirst->zString;
}

Assistant:

static int VmOverloadCompare(SyString *pFirst, SyString *pSecond)
{
	const char *zSend = &pSecond->zString[pSecond->nByte];
	const char *zFend = &pFirst->zString[pFirst->nByte];
	const char *zSin = pSecond->zString;
	const char *zFin = pFirst->zString;
	const char *zPtr = zFin;
	for(;;){
		if( zFin >= zFend || zSin >= zSend ){
			break;
		}
		if( zFin[0] != zSin[0] ){
			/* mismatch */
			break;
		}
		zFin++;
		zSin++;
	}
	return (int)(zFin-zPtr);
}